

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Frame * rw::Frame::create(void)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_20;
  Error _e;
  Frame *f;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x3000e,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/frame.cpp line: 31"
                        );
  if (_e == (Error)0x0) {
    local_20.plugin = 0xe;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/frame.cpp"
            ,0x21);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_20);
    f = (Frame *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    ctx = (EVP_PKEY_CTX *)0x0;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x0);
    LinkList::init((LinkList *)((long)_e + 0x20),ctx);
    *(undefined8 *)((long)_e + 0xb0) = 0;
    *(undefined8 *)((long)_e + 0xb8) = 0;
    *(Error *)((long)_e + 0xc0) = _e;
    Matrix::setIdentity((Matrix *)((long)_e + 0x30));
    Matrix::setIdentity((Matrix *)((long)_e + 0x70));
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    f = (Frame *)_e;
  }
  return f;
}

Assistant:

Frame*
Frame::create(void)
{
	Frame *f = (Frame*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_FRAMELIST);
	if(f == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	f->object.init(Frame::ID, 0);
	f->objectList.init();
	f->child = nil;
	f->next = nil;
	f->root = f;
	f->matrix.setIdentity();
	f->ltm.setIdentity();
	s_plglist.construct(f);
	return f;
}